

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwtest2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  char cVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  NaReal fOut;
  NaReal fIn;
  NaConfigPart *conf2_list [1];
  NaConfigPart *conf1_list [1];
  NaReal fTmp;
  NaTransFunc dtf2;
  NaTransFunc dtf1;
  NaConfigFile conf2_file;
  NaConfigFile conf1_file;
  double local_bb0;
  double local_ba8;
  double local_b98;
  double local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  double local_b78;
  NaTransFunc local_b70 [32];
  undefined1 local_b50 [232];
  NaTransFunc local_a68 [32];
  undefined1 local_a48 [232];
  NaConfigFile local_960 [1176];
  NaConfigFile local_4c8 [1176];
  
  if (argc - 8U < 0xfffffffe) {
    main_cold_1();
    iVar13 = 1;
  }
  else {
    if (argc == 7) {
      pcVar12 = argv[6];
    }
    else {
      pcVar12 = (char *)0x0;
    }
    pcVar1 = argv[3];
    pcVar2 = argv[4];
    pcVar3 = argv[5];
    NaOpenLogFile("dwtest.log");
    NaTransFunc::NaTransFunc(local_a68);
    NaTransFunc::NaTransFunc(local_b70);
    local_b80 = local_a48;
    local_b88 = local_b50;
    NaConfigFile::NaConfigFile(local_4c8,";NeuCon transfer",1,0,".cna","[ ] ;");
    NaConfigFile::NaConfigFile(local_960,";NeuCon transfer",1,0,".cna","[ ] ;");
    NaConfigFile::AddPartitions((uint)local_4c8,(NaConfigPart **)0x1);
    NaConfigFile::AddPartitions((uint)local_960,(NaConfigPart **)0x1);
    NaConfigFile::LoadFromFile((char *)local_4c8);
    NaConfigFile::LoadFromFile((char *)local_960);
    plVar7 = (long *)OpenInputDataFile(pcVar1);
    plVar8 = (long *)OpenInputDataFile(pcVar2);
    plVar9 = (long *)OpenOutputDataFile(pcVar3,bdtAuto,1);
    if (pcVar12 == (char *)0x0) {
      plVar10 = (long *)0x0;
    }
    else {
      plVar10 = (long *)OpenOutputDataFile(pcVar12,bdtAuto,1);
    }
    (**(code **)(*plVar7 + 0x28))(plVar7);
    (**(code **)(*plVar8 + 0x28))(plVar8);
    NaTransFunc::Reset();
    NaTransFunc::Reset();
    local_ba8 = 0.0;
    local_bb0 = 0.0;
    uVar5 = 1;
    do {
      uVar11 = uVar5;
      dVar14 = (double)(**(code **)(*plVar7 + 0x18))(plVar7,0);
      dVar15 = (double)(**(code **)(*plVar8 + 0x18))(plVar8,0);
      local_b90 = (dVar15 + dVar14) - local_ba8;
      NaTransFunc::Function((double *)local_a68,&local_b90);
      NaTransFunc::Function((double *)local_b70,&local_b78);
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 0x30))(plVar10);
        (**(code **)(*plVar10 + 0x10))(local_b90,plVar10);
      }
      (**(code **)(*plVar9 + 0x30))(plVar9);
      (**(code **)(*plVar9 + 0x10))(local_b98,plVar9);
      local_ba8 = local_b98;
      cVar6 = (**(code **)(*plVar7 + 0x20))(plVar7);
      local_bb0 = local_bb0 + (local_b98 - dVar14) * (local_b98 - dVar14);
      iVar4 = (int)uVar11;
      if (cVar6 == '\0') break;
      cVar6 = (**(code **)(*plVar8 + 0x20))(plVar8);
      uVar5 = (ulong)(iVar4 + 1);
    } while (cVar6 != '\0');
    iVar13 = 0;
    printf("Series length=%d samples\n",uVar11);
    printf("Mean squared error=%g\n",local_bb0 / (double)iVar4);
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 8))(plVar10);
    }
    (**(code **)(*plVar9 + 8))(plVar9);
    (**(code **)(*plVar8 + 8))(plVar8);
    (**(code **)(*plVar7 + 8))(plVar7);
    NaConfigFile::~NaConfigFile(local_960);
    NaConfigFile::~NaConfigFile(local_4c8);
    NaTransFunc::~NaTransFunc(local_b70);
    NaTransFunc::~NaTransFunc(local_a68);
  }
  return iVar13;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 6 && argc != 7)
    {
      fprintf(stderr, "Error: need 5 or 6 arguments\n");
      printf("Usage: dwtest2 ContrTrFunc PlantTrFunc SignalSeries NoiseSeries"\
	     " OutSeries [InSeries]\n");
      return 1;
    }

  char	*dtf1_file = argv[1];
  char	*dtf2_file = argv[2];
  char	*signal_file = argv[3];
  char	*noise_file = argv[4];
  char	*out_file = argv[5];
  char	*in_file = NULL;

  if(argc == 7)
    in_file = argv[6];

  NaOpenLogFile("dwtest.log");

  try{
    int			n;
    NaReal		e2, e;
    NaTransFunc		dtf1, dtf2;
    NaConfigPart	*conf1_list[] = { &dtf1 };
    NaConfigPart	*conf2_list[] = { &dtf2 };
    NaConfigFile	conf1_file(";NeuCon transfer", 1, 0);
    NaConfigFile	conf2_file(";NeuCon transfer", 1, 0);
    conf1_file.AddPartitions(NaNUMBER(conf1_list), conf1_list);
    conf2_file.AddPartitions(NaNUMBER(conf2_list), conf2_list);
    conf1_file.LoadFromFile(dtf1_file);
    conf2_file.LoadFromFile(dtf2_file);

    NaDataFile	*dfSignal = OpenInputDataFile(signal_file);
    NaDataFile	*dfNoise = OpenInputDataFile(noise_file);
    NaDataFile	*dfOut = OpenOutputDataFile(out_file, bdtAuto, 1);
    NaDataFile	*dfIn = NULL;

    if(NULL != in_file)
      dfIn = OpenOutputDataFile(in_file, bdtAuto, 1);

    dfSignal->GoStartRecord();
    dfNoise->GoStartRecord();
    dtf1.Reset();
    dtf2.Reset();
    n = 0;
    e = 0.;
    e2 = 0.;
    do{
      ++n;
      NaReal	fSignal, fNoise, fIn, fOut, fTmp;
      fSignal = dfSignal->GetValue();
      fNoise = dfNoise->GetValue();

      fIn = fSignal + fNoise - e;
      dtf1.Function(&fIn, &fTmp);
      dtf2.Function(&fTmp, &fOut);

      if(NULL != dfIn)
	{
	  dfIn->AppendRecord();
	  dfIn->SetValue(fIn);
	}

      dfOut->AppendRecord();
      dfOut->SetValue(fOut);

      e = fOut;
      e2 += (fOut - fSignal) * (fOut - fSignal);
    }while(dfSignal->GoNextRecord() && dfNoise->GoNextRecord());

    printf("Series length=%d samples\n", n);
    printf("Mean squared error=%g\n", e2/n);

    delete dfIn;
    delete dfOut;
    delete dfNoise;
    delete dfSignal;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}